

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O0

void __thiscall
tchecker::assign_statement_t::assign_statement_t
          (assign_statement_t *this,shared_ptr<const_tchecker::lvalue_expression_t> *lvalue,
          shared_ptr<const_tchecker::expression_t> *rvalue)

{
  element_type *peVar1;
  invalid_argument *piVar2;
  element_type *peVar3;
  shared_ptr<const_tchecker::expression_t> *rvalue_local;
  shared_ptr<const_tchecker::lvalue_expression_t> *lvalue_local;
  assign_statement_t *this_local;
  
  statement_t::statement_t((statement_t *)this);
  *(undefined ***)this = &PTR__assign_statement_t_00347ea8;
  *(undefined ***)this = &PTR__assign_statement_t_00347ea8;
  std::shared_ptr<const_tchecker::lvalue_expression_t>::shared_ptr(&this->_lvalue,lvalue);
  std::shared_ptr<const_tchecker::expression_t>::shared_ptr(&this->_rvalue,rvalue);
  peVar1 = std::__shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_lvalue).
                       super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                     );
  if (peVar1 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr lvalue");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_rvalue).
                       super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar3 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr rvalue");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

assign_statement_t::assign_statement_t(std::shared_ptr<tchecker::lvalue_expression_t const> const & lvalue,
                                       std::shared_ptr<tchecker::expression_t const> const & rvalue)
    : _lvalue(lvalue), _rvalue(rvalue)
{
  if (_lvalue.get() == nullptr)
    throw std::invalid_argument("nullptr lvalue");
  if (_rvalue.get() == nullptr)
    throw std::invalid_argument("nullptr rvalue");
}